

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void is_suite::is_integer_with_unsigned_int(void)

{
  undefined1 local_be;
  undefined1 local_bd [2];
  undefined1 local_bb;
  undefined1 local_ba [2];
  undefined1 local_b8;
  undefined1 local_b7 [2];
  undefined1 local_b5;
  undefined1 local_b4 [2];
  undefined1 local_b2;
  undefined1 local_b1 [2];
  undefined1 local_af;
  undefined1 local_ae [2];
  undefined1 local_ac;
  undefined1 local_ab [2];
  undefined1 local_a9;
  undefined1 local_a8 [2];
  undefined1 local_a6;
  undefined1 local_a5 [2];
  undefined1 local_a3;
  undefined1 local_a2 [2];
  undefined1 local_a0;
  undefined1 local_9f [2];
  undefined1 local_9d;
  undefined1 local_9c [2];
  undefined1 local_9a;
  undefined1 local_99 [2];
  undefined1 local_97;
  undefined1 local_96 [2];
  undefined1 local_94;
  undefined1 local_93 [2];
  undefined1 local_91;
  undefined1 local_90 [2];
  undefined1 local_8e;
  undefined1 local_8d [2];
  undefined1 local_8b;
  undefined1 local_8a [2];
  undefined1 local_88;
  undefined1 local_87 [2];
  undefined1 local_85;
  undefined1 local_84 [2];
  undefined1 local_82;
  undefined1 local_81 [2];
  undefined1 local_7f;
  undefined1 local_7e [2];
  undefined1 local_7c;
  undefined1 local_7b [2];
  undefined1 local_79;
  undefined1 local_78 [2];
  undefined1 local_76;
  undefined1 local_75 [2];
  undefined1 local_73;
  undefined1 local_72 [2];
  undefined1 local_70;
  undefined1 local_6f [2];
  undefined1 local_6d;
  undefined1 local_6c [2];
  undefined1 local_6a;
  undefined1 local_69 [2];
  undefined1 local_67;
  undefined1 local_66 [2];
  undefined1 local_64;
  undefined1 local_63 [2];
  undefined1 local_61;
  undefined1 local_60 [2];
  undefined1 local_5e;
  undefined1 local_5d [2];
  undefined1 local_5b;
  undefined1 local_5a [2];
  undefined1 local_58;
  undefined1 local_57 [2];
  undefined1 local_55;
  undefined1 local_54 [2];
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f;
  undefined1 local_4e [19];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_38,2);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<integer>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x34a,"void is_suite::is_integer_with_unsigned_int()",local_3a,&local_3b);
  local_4e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x34c,"void is_suite::is_integer_with_unsigned_int()",local_4e,&local_4f);
  local_51[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<signed_char_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_52 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x34d,"void is_suite::is_integer_with_unsigned_int()",local_51,&local_52);
  local_54[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_55 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x34e,"void is_suite::is_integer_with_unsigned_int()",local_54,&local_55);
  local_57[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_char_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_58 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x34f,"void is_suite::is_integer_with_unsigned_int()",local_57,&local_58);
  local_5a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<short>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_5b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x350,"void is_suite::is_integer_with_unsigned_int()",local_5a,&local_5b);
  local_5d[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<short_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_5e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x351,"void is_suite::is_integer_with_unsigned_int()",local_5d,&local_5e);
  local_60[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_short>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_61 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x352,"void is_suite::is_integer_with_unsigned_int()",local_60,&local_61);
  local_63[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x353,"void is_suite::is_integer_with_unsigned_int()",local_63,&local_64);
  local_66[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_67 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x354,"void is_suite::is_integer_with_unsigned_int()",local_66,&local_67);
  local_69[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_6a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x355,"void is_suite::is_integer_with_unsigned_int()",local_69,&local_6a);
  local_6c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_6d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x356,"void is_suite::is_integer_with_unsigned_int()",local_6c,&local_6d);
  local_6f[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<long_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_70 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x357,"void is_suite::is_integer_with_unsigned_int()",local_6f,&local_70);
  local_72[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_73 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x358,"void is_suite::is_integer_with_unsigned_int()",local_72,&local_73);
  local_75[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_76 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x359,"void is_suite::is_integer_with_unsigned_int()",local_75,&local_76);
  local_78[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<long_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_79 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x35a,"void is_suite::is_integer_with_unsigned_int()",local_78,&local_79);
  local_7b[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<long_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_7c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x35b,"void is_suite::is_integer_with_unsigned_int()",local_7b,&local_7c);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x35c,"void is_suite::is_integer_with_unsigned_int()",local_7e,&local_7f);
  local_81[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_82 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x35d,"void is_suite::is_integer_with_unsigned_int()",local_81,&local_82);
  local_84[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_85 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x35f,"void is_suite::is_integer_with_unsigned_int()",local_84,&local_85);
  local_87[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_const>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_88 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x360,"void is_suite::is_integer_with_unsigned_int()",local_87,&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x361,"void is_suite::is_integer_with_unsigned_int()",local_8a,&local_8b);
  local_8d[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_volatile>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_8e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x362,"void is_suite::is_integer_with_unsigned_int()",local_8d,&local_8e);
  local_90[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_91 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x363,"void is_suite::is_integer_with_unsigned_int()",local_90,&local_91);
  local_93[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_94 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x365,"void is_suite::is_integer_with_unsigned_int()",local_93,&local_94);
  local_96[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_97 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x366,"void is_suite::is_integer_with_unsigned_int()",local_96,&local_97);
  local_99[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_9a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x367,"void is_suite::is_integer_with_unsigned_int()",local_99,&local_9a);
  local_9c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_9d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x368,"void is_suite::is_integer_with_unsigned_int()",local_9c,&local_9d);
  local_9f[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x369,"void is_suite::is_integer_with_unsigned_int()",local_9f,&local_a0);
  local_a2[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_a3 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x36a,"void is_suite::is_integer_with_unsigned_int()",local_a2,&local_a3);
  local_a5[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_a6 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x36b,"void is_suite::is_integer_with_unsigned_int()",local_a5,&local_a6);
  local_a8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x36c,"void is_suite::is_integer_with_unsigned_int()",local_a8,&local_a9);
  local_ab[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x36d,"void is_suite::is_integer_with_unsigned_int()",local_ab,&local_ac);
  local_ae[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_af = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x36e,"void is_suite::is_integer_with_unsigned_int()",local_ae,&local_af);
  local_b1[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_int&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_b2 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x370,"void is_suite::is_integer_with_unsigned_int()",local_b1,&local_b2);
  local_b4[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_int_const>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_b5 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const unsigned int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x371,"void is_suite::is_integer_with_unsigned_int()",local_b4,&local_b5);
  local_b7[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_int_const&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_b8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const unsigned int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x372,"void is_suite::is_integer_with_unsigned_int()",local_b7,&local_b8);
  local_ba[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_int_volatile>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_bb = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile unsigned int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x373,"void is_suite::is_integer_with_unsigned_int()",local_ba,&local_bb);
  local_bd[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_int_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_be = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile unsigned int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x374,"void is_suite::is_integer_with_unsigned_int()",local_bd,&local_be);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void is_integer_with_unsigned_int()
{
    variable data(2U);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<integer>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long long int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile unsigned int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const unsigned int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const unsigned int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile unsigned int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile unsigned int&>(), false);
}